

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O0

void google::protobuf::internal::WireFormat::SerializeWithCachedSizes
               (Message *message,int size,CodedOutputStream *output)

{
  CodedOutputStream *this;
  Message *message_00;
  int iVar1;
  int v2;
  uint8_t *puVar2;
  EpsCopyOutputStream *stream;
  char *failure_msg;
  LogMessage *pLVar3;
  LogMessage local_48;
  Voidify local_31;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CodedOutputStream *pCStack_20;
  int expected_endpoint;
  CodedOutputStream *output_local;
  Message *pMStack_10;
  int size_local;
  Message *message_local;
  
  pCStack_20 = output;
  output_local._4_4_ = size;
  pMStack_10 = message;
  iVar1 = protobuf::io::CodedOutputStream::ByteCount(output);
  message_00 = pMStack_10;
  this = pCStack_20;
  absl_log_internal_check_op_result._4_4_ = iVar1 + output_local._4_4_;
  puVar2 = protobuf::io::CodedOutputStream::Cur(pCStack_20);
  stream = protobuf::io::CodedOutputStream::EpsCopy(pCStack_20);
  puVar2 = _InternalSerialize(message_00,puVar2,stream);
  protobuf::io::CodedOutputStream::SetCur(this,puVar2);
  iVar1 = protobuf::io::CodedOutputStream::ByteCount(pCStack_20);
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar1);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue
                 (absl_log_internal_check_op_result._4_4_);
  local_30 = absl::lts_20250127::log_internal::Check_EQImpl
                       (iVar1,v2,"output->ByteCount() == expected_endpoint");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.h"
               ,0x73,failure_msg);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [150])
                               ": Protocol message serialized to a size different from what was originally expected.  Perhaps it was modified by another thread during serialization?"
                       );
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  return;
}

Assistant:

static void SerializeWithCachedSizes(const Message& message, int size,
                                       io::CodedOutputStream* output) {
    int expected_endpoint = output->ByteCount() + size;
    output->SetCur(
        _InternalSerialize(message, output->Cur(), output->EpsCopy()));
    ABSL_CHECK_EQ(output->ByteCount(), expected_endpoint)
        << ": Protocol message serialized to a size different from what was "
           "originally expected.  Perhaps it was modified by another thread "
           "during serialization?";
  }